

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int memory_not_equal_display_error(char *a,char *b,size_t size)

{
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  char r;
  char l;
  size_t i;
  size_t same;
  ulong local_30;
  ulong local_28;
  uint local_4;
  
  local_28 = 0;
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    if (*(char *)(in_RDI + local_30) == *(char *)(in_RSI + local_30)) {
      local_28 = local_28 + 1;
    }
  }
  if (local_28 == in_RDX) {
    cm_print_error("%zdbytes of %p and %p the same\n",local_28,in_RDI,in_RSI);
  }
  local_4 = (uint)(local_28 != in_RDX);
  return local_4;
}

Assistant:

static int memory_not_equal_display_error(
        const char* const a, const char* const b, const size_t size) {
    size_t same = 0;
    size_t i;
    for (i = 0; i < size; i++) {
        const char l = a[i];
        const char r = b[i];
        if (l == r) {
            same ++;
        }
    }
    if (same == size) {
        cm_print_error("%"PRIdS "bytes of %p and %p the same\n",
                       same, (void *)a, (void *)b);
        return 0;
    }
    return 1;
}